

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

bool slang::syntax::PortListSyntax::isKind(SyntaxKind kind)

{
  bool bVar1;
  
  bVar1 = true;
  if (((kind != AnsiPortList) && (kind != NonAnsiPortList)) && (kind != WildcardPortList)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool PortListSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AnsiPortList:
        case SyntaxKind::NonAnsiPortList:
        case SyntaxKind::WildcardPortList:
            return true;
        default:
            return false;
    }
}